

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

lua_Alloc lua_getallocf(lua_State *L,void **ud)

{
  if (ud != (void **)0x0) {
    *ud = L->l_G->ud;
  }
  return L->l_G->frealloc;
}

Assistant:

LUA_API lua_Alloc lua_getallocf(lua_State *L, void **ud) {
    lua_Alloc f;
    lua_lock(L);
    if (ud) *ud = G(L)->ud;
    f = G(L)->frealloc;
    lua_unlock(L);
    return f;
}